

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-listen.c
# Opt level: O2

int rops_handle_POLLIN_listen(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  lws_context *plVar1;
  lws_vhost *vh;
  lws_adoption_type type;
  int iVar2;
  lws_adoption_type lVar3;
  lws *plVar4;
  int *piVar5;
  lws_filter_network_conn_args filt;
  
  plVar1 = (wsi->a).context;
  memset(&filt,0,0x88);
  if ((((wsi->a).vhost)->field_0x368 & 4) == 0) {
    while( true ) {
      if ((pollfd->revents & 5) == 0) {
        return 5;
      }
      if ((pollfd->events & 1) == 0) {
        return 5;
      }
      if ((((((wsi->a).vhost)->tls).use_ssl != 0) && (plVar1->simultaneous_ssl_restriction != 0)) &&
         (plVar1->simultaneous_ssl == plVar1->simultaneous_ssl_restriction)) {
        return 5;
      }
      filt.clilen = 0x80;
      filt.accept_fd = accept(pollfd->fd,(sockaddr *)&filt,&filt.clilen);
      if (filt.accept_fd == -1) break;
      if ((plVar1->field_0x7b7 & 4) != 0) {
        close(filt.accept_fd);
        return 6;
      }
      lws_plat_set_socket_options((wsi->a).vhost,filt.accept_fd,0);
      _lws_log(0x10,"accepted new conn port %u on fd=%d\n",
               (ulong)(ushort)(filt.cli_addr.__ss_padding._0_2_ << 8 |
                              (ushort)filt.cli_addr.__ss_padding._0_2_ >> 8),
               (ulong)(uint)filt.accept_fd);
      iVar2 = (*((wsi->a).vhost)->protocols->callback)
                        (wsi,LWS_CALLBACK_FILTER_NETWORK_CONNECTION,&filt,
                         (void *)(long)filt.accept_fd,0);
      if (iVar2 != 0) {
        _lws_log(0x10,"Callback denied net connection\n");
        close(filt.accept_fd);
        return 5;
      }
      vh = (wsi->a).vhost;
      lVar3 = (LWS_ADOPT_ALLOW_SSL|LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP) -
              (((uint)vh->options >> 0x16 & 1) != 0);
      type = lVar3 & (LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP);
      if ((vh->tls).use_ssl != 0) {
        type = lVar3;
      }
      plVar4 = lws_adopt_descriptor_vhost
                         (vh,type,(lws_sock_file_fd_type)filt.accept_fd,vh->listen_accept_protocol,
                          (lws *)0x0);
      if (plVar4 == (lws *)0x0) {
        _lws_log(8,"%s: vh %s: adopt failed\n","rops_handle_POLLIN_listen",((wsi->a).vhost)->name);
        return 4;
      }
      if (plVar1->fd_limit_per_thread - 1 <= pt->fds_count) {
        return 5;
      }
      if ((long)wsi->position_in_fds_table == -1) {
        return 5;
      }
      iVar2 = lws_poll_listen_fd(pt->fds + wsi->position_in_fds_table);
      if (iVar2 < 1) {
        return 5;
      }
    }
    piVar5 = __errno_location();
    if (*piVar5 != 0xb) {
      _lws_log(1,"accept: errno %d\n");
    }
  }
  return 5;
}

Assistant:

static int
rops_handle_POLLIN_listen(struct lws_context_per_thread *pt, struct lws *wsi,
			  struct lws_pollfd *pollfd)
{
	struct lws_context *context = wsi->a.context;
	struct lws_filter_network_conn_args filt;
	lws_sock_file_fd_type fd;

	memset(&filt, 0, sizeof(filt));

	/* if our vhost is going down, ignore it */

	if (wsi->a.vhost->being_destroyed)
		return LWS_HPI_RET_HANDLED;

	/* pollin means a client has connected to us then
	 *
	 * pollout is a hack on esp32 for background accepts signalling
	 * they completed
	 */

	do {
		struct lws *cwsi;
		int opts = LWS_ADOPT_SOCKET | LWS_ADOPT_ALLOW_SSL;

		if (!(pollfd->revents & (LWS_POLLIN | LWS_POLLOUT)) ||
		    !(pollfd->events & LWS_POLLIN))
			break;

#if defined(LWS_WITH_TLS)
		/*
		 * can we really accept it, with regards to SSL limit?
		 * another vhost may also have had POLLIN on his
		 * listener this round and used it up already
		 */
		if (wsi->a.vhost->tls.use_ssl &&
		    context->simultaneous_ssl_restriction &&
		    context->simultaneous_ssl ==
				  context->simultaneous_ssl_restriction)
			/*
			 * no... ignore it, he won't come again until
			 * we are below the simultaneous_ssl_restriction
			 * limit and POLLIN is enabled on him again
			 */
			break;
#endif
		/* listen socket got an unencrypted connection... */

		filt.clilen = sizeof(filt.cli_addr);

		/*
		 * We cannot identify the peer who is in the listen
		 * socket connect queue before we accept it; even if
		 * we could, not accepting it due to PEER_LIMITS would
		 * block the connect queue for other legit peers.
		 */

		filt.accept_fd = accept((int)pollfd->fd,
					(struct sockaddr *)&filt.cli_addr,
					&filt.clilen);
		if (filt.accept_fd == LWS_SOCK_INVALID) {
			if (LWS_ERRNO == LWS_EAGAIN ||
			    LWS_ERRNO == LWS_EWOULDBLOCK) {
				break;
			}
			lwsl_err("accept: errno %d\n", LWS_ERRNO);

			return LWS_HPI_RET_HANDLED;
		}

		if (context->being_destroyed) {
			compatible_close(filt.accept_fd);

			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		lws_plat_set_socket_options(wsi->a.vhost, filt.accept_fd, 0);

#if defined(LWS_WITH_IPV6)
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			((filt.cli_addr.ss_family == AF_INET6) ?
			ntohs(((struct sockaddr_in6 *) &filt.cli_addr)->sin6_port) :
			ntohs(((struct sockaddr_in *) &filt.cli_addr)->sin_port)),
			filt.accept_fd);
#else
		{
		struct sockaddr_in sain;

		memcpy(&sain, &filt.cli_addr, sizeof(sain));
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			   ntohs(sain.sin_port),
			   filt.accept_fd);
		}
#endif

		/*
		 * look at who we connected to and give user code a
		 * chance to reject based on client IP.  There's no
		 * protocol selected yet so we issue this to
		 * protocols[0]
		 */
		if ((wsi->a.vhost->protocols[0].callback)(wsi,
				LWS_CALLBACK_FILTER_NETWORK_CONNECTION,
				(void *)&filt,
				(void *)(lws_intptr_t)filt.accept_fd, 0)) {
			lwsl_debug("Callback denied net connection\n");
			compatible_close(filt.accept_fd);
			return LWS_HPI_RET_HANDLED;
		}

		if (!(wsi->a.vhost->options &
			LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG))
			opts |= LWS_ADOPT_HTTP;

#if defined(LWS_WITH_TLS)
		if (!wsi->a.vhost->tls.use_ssl)
#endif
			opts &= ~LWS_ADOPT_ALLOW_SSL;

		fd.sockfd = filt.accept_fd;
		cwsi = lws_adopt_descriptor_vhost(wsi->a.vhost, (lws_adoption_type)opts, fd,
				wsi->a.vhost->listen_accept_protocol, NULL);
		if (!cwsi) {
			lwsl_info("%s: vh %s: adopt failed\n", __func__,
					wsi->a.vhost->name);

			/* already closed cleanly as necessary */
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}
/*
		if (lws_server_socket_service_ssl(cwsi, accept_fd, 1)) {
			lws_close_free_wsi(cwsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "listen svc fail");
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}

		lwsl_info("%s: new %s: wsistate 0x%lx, role_ops %s\n",
			    __func__, lws_wsi_tag(cwsi), (unsigned long)cwsi->wsistate,
			    cwsi->role_ops->name);
*/

	} while (pt->fds_count < context->fd_limit_per_thread - 1 &&
		 wsi->position_in_fds_table != LWS_NO_FDS_POS &&
		 lws_poll_listen_fd(&pt->fds[wsi->position_in_fds_table]) > 0);

	return LWS_HPI_RET_HANDLED;
}